

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.cpp
# Opt level: O2

uint16_t rudp::checksum(uint8_t *begin,uint8_t *end)

{
  uint16_t uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = (long)end - (long)begin;
  if (uVar4 != 0) {
    uVar2 = 0xffff;
    for (uVar3 = 0; (uVar4 & 0xfffffffffffffffe) != uVar3; uVar3 = uVar3 + 2) {
      uVar5 = (uint)(ushort)(*(ushort *)(begin + uVar3) << 8 | *(ushort *)(begin + uVar3) >> 8);
      uVar6 = uVar2 + uVar5;
      uVar2 = (uVar2 - 0xffff) + uVar5;
      if (uVar6 < 0x10000) {
        uVar2 = uVar6;
      }
    }
    if ((uVar4 & 1) != 0) {
      uVar5 = (uint)begin[uVar4 - 1] * 0x100 + uVar2;
      uVar2 = (uint)begin[uVar4 - 1] * 0x100 + -0xffff + uVar2;
      if (uVar5 < 0x10000) {
        uVar2 = uVar5;
      }
    }
    uVar1 = 0xffff;
    if ((ushort)uVar2 != 0xffff) {
      uVar1 = ~(ushort)uVar2;
    }
    return uVar1;
  }
  return 0xffff;
}

Assistant:

uint16_t checksum( const uint8_t *begin, const uint8_t *end ) {
    size_t length = std::distance( begin, end );
    if( length == 0 ) return 0xFFFF;
    const auto wbegin = reinterpret_cast< const uint16_t* >( begin );
    const auto wend = std::next( wbegin, length / 2u );
    auto sum = std::accumulate( wbegin, wend, uint32_t( 0xFFFF ), []( uint32_t sum, uint16_t v ) {
      sum += ntohs( v );
      if( sum > 0xFFFF ) sum -= 0xFFFF;
      return sum;
    } );
    if( length % 2 ) {
      sum += uint16_t( begin[ length - 1 ] ) << 8;
      if( sum > 0xFFFF ) sum -= 0xFFFF;
    }
    sum = ~sum;
    return ( uint16_t( sum ) == 0x0000 ) ? 0xFFFF : sum;
  }